

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::JavascriptString*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
           *this,JavascriptString **key)

{
  long lVar1;
  bool bVar2;
  hash_t hashCode;
  uint uVar3;
  long lVar4;
  int *piVar5;
  DictionaryStats *this_00;
  int iVar6;
  
  lVar4 = *(long *)this;
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    hashCode = GetHashCodeWithKey<Js::JavascriptString*>(key);
    uVar3 = BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                         *)this,hashCode);
    lVar1 = *(long *)(this + 8);
    piVar5 = (int *)(lVar4 + (ulong)uVar3 * 4);
    uVar3 = 0;
    while( true ) {
      iVar6 = *piVar5;
      if ((long)iVar6 < 0) break;
      lVar4 = (long)iVar6 * 0x18;
      bVar2 = Js::PropertyRecordStringHashComparer<const_Js::PropertyRecord_*>::Equals
                        (*(PropertyRecord **)(lVar1 + 0x10 + lVar4),*key);
      if (bVar2) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_00ca20bb;
      }
      uVar3 = uVar3 + 1;
      piVar5 = (int *)(lVar4 + lVar1 + 8);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar6 = -1;
LAB_00ca20bb:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }